

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhexview.cpp
# Opt level: O3

qreal __thiscall QHexView::cellWidth(QHexView *this)

{
  qreal qVar1;
  QByteArrayView QVar2;
  QArrayData *local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  QArrayData *local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  
  QVar2.m_data = (storage_type *)0x1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  local_48 = local_28;
  uStack_40 = uStack_20;
  local_38 = local_18;
  qVar1 = (qreal)QFontMetricsF::horizontalAdvance((QString *)&this->m_fontmetrics,(int)&local_48);
  if (local_48 != (QArrayData *)0x0) {
    LOCK();
    (local_48->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_48->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_48->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_48,2,8);
    }
  }
  return qVar1;
}

Assistant:

qreal QHexView::cellWidth() const {
#if QT_VERSION >= QT_VERSION_CHECK(5, 11, 0)
    return m_fontmetrics.horizontalAdvance(" ");
#else
    return m_fontmetrics.width(" ");
#endif
}